

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

void __thiscall
Omega_h::HostWrite<int>::HostWrite
          (HostWrite<int> *this,LO size_in,int offset,int stride,string *name_in)

{
  Write<int> local_38;
  string *local_28;
  string *name_in_local;
  int local_18;
  int stride_local;
  int offset_local;
  LO size_in_local;
  HostWrite<int> *this_local;
  
  local_28 = name_in;
  name_in_local._4_4_ = stride;
  local_18 = offset;
  stride_local = size_in;
  _offset_local = this;
  Write<int>::Write(&local_38,size_in,offset,stride,name_in);
  HostWrite(this,&local_38);
  Write<int>::~Write(&local_38);
  return;
}

Assistant:

HostWrite<T>::HostWrite(
    LO size_in, T offset, T stride, std::string const& name_in)
    : HostWrite<T>(Write<T>(size_in, offset, stride, name_in)) {}